

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O3

void __thiscall xmrig::NetworkState::add(NetworkState *this,SubmitResult *result,char *error)

{
  iterator __position;
  ulong uVar1;
  uint64_t *local_40;
  array<unsigned_long,_10UL> *local_38;
  uint64_t *local_30;
  array<unsigned_long,_10UL> *local_28;
  
  if (error == (char *)0x0) {
    this->accepted = this->accepted + 1;
    this->total = this->total + result->diff;
    if ((this->topDiff)._M_elems[9] < result->actualDiff) {
      (this->topDiff)._M_elems[9] = result->actualDiff;
      local_40 = &this->accepted;
      local_28 = &this->topDiff;
      std::
      __introsort_loop<std::reverse_iterator<unsigned_long*>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_40,&local_28,6);
      local_38 = &this->topDiff;
      local_30 = &this->accepted;
      std::
      __final_insertion_sort<std::reverse_iterator<unsigned_long*>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    uVar1 = 0xffff;
    if (result->elapsed < 0xffff) {
      uVar1 = result->elapsed;
    }
    local_40 = (uint64_t *)CONCAT62(local_40._2_6_,(unsigned_short)uVar1);
    __position._M_current =
         (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>(&this->m_latency,__position,(unsigned_short *)&local_40);
    }
    else {
      *__position._M_current = (unsigned_short)uVar1;
      (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    this->rejected = this->rejected + 1;
  }
  return;
}

Assistant:

void xmrig::NetworkState::add(const SubmitResult &result, const char *error)
{
    if (error) {
        rejected++;
        return;
    }

    accepted++;
    total += result.diff;

    const size_t ln = topDiff.size() - 1;
    if (result.actualDiff > topDiff[ln]) {
        topDiff[ln] = result.actualDiff;
        std::sort(topDiff.rbegin(), topDiff.rend());
    }

    m_latency.push_back(result.elapsed > 0xFFFF ? 0xFFFF : static_cast<uint16_t>(result.elapsed));
}